

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void ProcessThread::wakeup(Signal sig)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  undefined1 local_e;
  undefined1 local_d;
  Signal local_c;
  char b;
  Signal sig_local;
  
  local_e = 0x73;
  if (sig != Stop) {
    local_e = 99;
  }
  local_d = local_e;
  local_c = sig;
  do {
    sVar1 = write(sProcessPipe[1],&local_d,1);
    if (-1 < sVar1) {
      return;
    }
    piVar2 = __errno_location();
    bVar3 = true;
    if (*piVar2 != 4) {
      piVar2 = __errno_location();
      bVar3 = true;
      if (*piVar2 != 0xb) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 0xb;
      }
    }
  } while (bVar3);
  return;
}

Assistant:

void ProcessThread::wakeup(Signal sig)
{
    const char b = sig == Stop ? 's' : 'c';
    // printf("sending pid %d\n", pid);
    do {
        if (::write(sProcessPipe[1], &b, sizeof(char)) >= 0)
            break;
    } while (errno == EINTR || errno == EAGAIN || errno == EWOULDBLOCK);
    // printf("sent pid %ld\n", written);
}